

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<int,_false,_6> __thiscall
immutable::vector<int,_false,_6>::erase(vector<int,_false,_6> *this,size_type_conflict pos)

{
  undefined4 in_register_00000034;
  vector<int,_false,_6> local_30;
  vector<int,_false,_6> local_28 [2];
  undefined8 uStack_18;
  size_type_conflict pos_local;
  vector<int,_false,_6> *this_local;
  
  uStack_18 = CONCAT44(in_register_00000034,pos);
  this_local = this;
  take(local_28,pos);
  drop(&local_30,pos);
  operator+((immutable *)this,local_28,&local_30);
  ~vector(&local_30);
  ~vector(local_28);
  return (vector<int,_false,_6>)(ref<immutable::rrb<int,_false,_6>_>)this;
}

Assistant:

vector erase(size_type pos) const
        {        
        return take(pos) + drop(pos + 1);
        }